

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall
TPZMatrix<Fad<long_double>_>::VerifySymmetry(TPZMatrix<Fad<long_double>_> *this,REAL tol)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  longdouble *plVar4;
  ostream *poVar5;
  longdouble *plVar6;
  longdouble *plVar7;
  ulong uVar8;
  longdouble *plVar9;
  longdouble *plVar10;
  long lVar11;
  Fad<long_double> exp;
  long local_108;
  long local_100;
  Fad<long_double> local_e8;
  long local_b8;
  undefined8 local_b0;
  REAL local_a8;
  double local_a0;
  Fad<long_double> local_98;
  Fad<long_double> local_68;
  
  local_b8 = (this->super_TPZBaseMatrix).fRow;
  uVar3 = 0;
  if (local_b8 == (this->super_TPZBaseMatrix).fCol) {
    if (local_b8 < 1) {
      local_b0 = 1;
    }
    else {
      local_100 = 1;
      local_b0 = 0;
      local_108 = 0;
      local_a8 = tol;
      do {
        lVar11 = 0;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                    (&local_98,this,local_108,lVar11);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                    (&local_68,this,lVar11,local_108);
          iVar2 = local_68.dx_.num_elts;
          iVar1 = local_98.dx_.num_elts;
          local_e8.val_ = local_98.val_ - local_68.val_;
          uVar3 = local_68.dx_.num_elts;
          if (local_68.dx_.num_elts < local_98.dx_.num_elts) {
            uVar3 = local_98.dx_.num_elts;
          }
          local_e8.dx_.num_elts = 0;
          local_e8.dx_.ptr_to_data = (longdouble *)0x0;
          if (0 < (int)uVar3) {
            uVar8 = (ulong)uVar3;
            local_e8.dx_.num_elts = uVar3;
            local_e8.dx_.ptr_to_data = (longdouble *)operator_new__(uVar8 << 4);
            plVar4 = local_e8.dx_.ptr_to_data;
            plVar6 = local_98.dx_.ptr_to_data;
            plVar7 = local_68.dx_.ptr_to_data;
            do {
              plVar9 = plVar6;
              if (iVar1 == 0) {
                plVar9 = &local_98.defaultVal;
              }
              plVar10 = plVar7;
              if (iVar2 == 0) {
                plVar10 = &local_68.defaultVal;
              }
              *plVar4 = *plVar9 - *plVar10;
              plVar4 = plVar4 + 1;
              plVar7 = plVar7 + 1;
              plVar6 = plVar6 + 1;
              uVar8 = uVar8 - 1;
            } while (uVar8 != 0);
          }
          local_e8.defaultVal = (longdouble)0;
          Fad<long_double>::~Fad(&local_68);
          Fad<long_double>::~Fad(&local_98);
          local_a0 = (double)local_e8.val_;
          if (local_a8 < ABS(local_a0)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Elemento: ",10);
            poVar5 = std::ostream::_M_insert<long>((long)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
            poVar5 = std::ostream::_M_insert<long>((long)poVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  -> ",5);
            poVar5 = ::operator<<(poVar5,&local_e8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/",1);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                      (&local_98,this,local_108,lVar11);
            poVar5 = ::operator<<(poVar5,&local_98);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            Fad<long_double>::~Fad(&local_98);
            Fad<long_double>::~Fad(&local_e8);
            goto LAB_00c9b8d3;
          }
          Fad<long_double>::~Fad(&local_e8);
          lVar11 = lVar11 + 1;
        } while (lVar11 != local_100);
        local_108 = local_108 + 1;
        local_100 = local_100 + 1;
        local_b0 = CONCAT71((int7)((ulong)local_b8 >> 8),local_b8 <= local_108);
      } while (local_108 != local_b8);
    }
LAB_00c9b8d3:
    uVar3 = (uint)local_b0 & 1;
  }
  return uVar3;
}

Assistant:

int TPZMatrix<TVar>::VerifySymmetry(REAL tol) const{
	int64_t nrows = this->Rows();
	int64_t ncols = this->Cols();
	if (nrows != ncols) return 0;
	
	for( int64_t i = 0; i < nrows; i++){
		for(int64_t j = 0; j <= i; j++){
            TVar exp = this->Get(i,j) - this->Get(j,i);
			if ( (REAL)(fabs( exp )) > tol ) {
			  	#ifdef STATE_COMPLEX
				cout << "Elemento: " << i << ", " << j << "  -> " << fabs( exp ) << "/" <<
				this->Get(i,j) << endl;
				#else
				cout << "Elemento: " << i << ", " << j << "  -> " << exp << "/" <<
				this->Get(i,j) << endl;
				#endif
				return 0;
			}
		}
	}
	return 1;
}